

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O3

void __kmp_dispatch_init<long_long>
               (ident_t *loc,int gtid,sched_type schedule,longlong lb,longlong ub,
               signed_t_conflict st,signed_t_conflict chunk,int push_ws)

{
  int iVar1;
  kmp_info_t *pkVar2;
  kmp_team_p *pkVar3;
  ident_t *piVar4;
  int iVar5;
  kmp_info_t *pkVar6;
  sched_type *psVar7;
  ulong uVar8;
  code *pcVar9;
  long lVar10;
  ulong uVar11;
  kmp_int64 *pkVar12;
  code *pcVar13;
  kmp_disp_t *pkVar14;
  kmp_disp_t *pkVar15;
  ulong uVar16;
  ulong uVar17;
  sched_type sVar18;
  ulong uVar19;
  char *pcVar20;
  kmp_disp_t *pkVar21;
  cons_type ct;
  uint uVar22;
  kmp_disp_t *pkVar23;
  ulong uVar24;
  kmp_uint64 sched_type;
  long lVar25;
  dispatch_private_info_t *pdVar26;
  sched_type sVar27;
  bool bVar28;
  bool bVar29;
  longdouble lVar30;
  longdouble lVar31;
  longdouble lVar32;
  longdouble lVar33;
  longdouble lVar34;
  uint local_110;
  kmp_disp_t *local_100;
  dispatch_shared_info_t *local_a0;
  kmp_msg_t local_78;
  kmp_msg_t local_48;
  
  if (__kmp_init_parallel == 0) {
    __kmp_parallel_initialize();
  }
  pkVar6 = (kmp_info_t *)__kmp_threads;
  pkVar2 = __kmp_threads[gtid];
  pkVar3 = (pkVar2->th).th_team;
  iVar1 = (pkVar3->t).t_serialized;
  (pkVar2->th).th_ident = loc;
  bVar29 = false;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (__kmp_forkjoin_frames_mode == 3)) {
    pkVar6 = *(kmp_info_t **)((long)pkVar6 + (long)gtid * 8);
    if ((*(int *)(pkVar6->th_pad + 0x20) == 0) &&
       ((pkVar2->th).th_teams_microtask == (microtask_t)0x0)) {
      bVar29 = (pkVar3->t).t_active_level == 1;
    }
    else {
      bVar29 = false;
    }
  }
  local_110 = (uint)pkVar6;
  pkVar14 = (pkVar2->th).th_dispatch;
  if (iVar1 == 0) {
    local_110 = pkVar14->th_disp_index;
    pkVar14->th_disp_index = local_110 + 1;
    pdVar26 = ((pkVar2->th).th_dispatch)->th_disp_buffer +
              (ulong)local_110 % (ulong)(uint)__kmp_dispatch_num_buffers;
    local_a0 = (pkVar3->t).t_disp_buffer +
               (ulong)local_110 % (ulong)(uint)__kmp_dispatch_num_buffers;
  }
  else {
    pdVar26 = pkVar14->th_disp_buffer;
  }
  sVar18 = kmp_sch_static_steal;
  if ((schedule >> 0x1e & 1) == 0) {
    sVar18 = schedule & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  }
  bVar28 = sVar18 - kmp_nm_lower < 0x28;
  sVar27 = sVar18 - 0x80;
  if (!bVar28) {
    sVar27 = sVar18;
  }
  pdVar26->nomerge = (uint)bVar28;
  pdVar26->type_size = 8;
  sVar18 = sVar27 - kmp_sch_lower;
  if ((sVar27 & kmp_ord_lower) == 0) {
    sVar18 = sVar27;
  }
  pdVar26->ordered = (sVar27 & kmp_ord_lower) >> 6;
  if (sVar18 == kmp_sch_runtime) {
    sVar27 = (pkVar3->t).t_sched.field_0.r_sched_type;
    if (sVar27 == kmp_sch_default) {
      psVar7 = &__kmp_static;
LAB_0014c32e:
      sVar27 = *psVar7;
    }
    else if (sVar27 == kmp_sch_guided_chunked) {
      psVar7 = &__kmp_guided;
      goto LAB_0014c32e;
    }
    pkVar14 = (kmp_disp_t *)(long)(pkVar3->t).t_sched.field_0.chunk;
    local_100 = pkVar14;
LAB_0014c33b:
    chunk = (signed_t_conflict)pkVar14;
    if (sVar27 == kmp_sch_auto) {
      sVar27 = __kmp_auto;
    }
    if (sVar27 == kmp_sch_runtime_simd) {
      sVar18 = (pkVar3->t).t_sched.field_0.r_sched_type;
      sVar27 = kmp_sch_static_balanced_chunked;
      local_100 = (kmp_disp_t *)chunk;
      if (((sVar18 & 0xfffffffb) != kmp_sch_default) && (sVar18 != __kmp_static)) {
        sVar27 = sVar18;
        if (sVar18 == __kmp_guided) {
          sVar27 = kmp_sch_guided_simd;
        }
        if (sVar18 == kmp_sch_guided_chunked) {
          sVar27 = kmp_sch_guided_simd;
        }
        chunk = chunk * (pkVar3->t).t_sched.field_0.chunk;
        local_100 = (kmp_disp_t *)chunk;
      }
    }
    else if ((sVar27 == kmp_sch_guided_analytical_chunked) &&
            (sVar27 = kmp_sch_guided_analytical_chunked, 0x100000 < (pkVar2->th).th_team_nproc)) {
      __kmp_msg_format(&local_48,0x40059);
      __kmp_msg(kmp_ms_warning);
      sVar27 = kmp_sch_guided_iterative_chunked;
    }
    (pdVar26->u).p64.field_6.parm1 = chunk;
  }
  else {
    sVar27 = __kmp_guided;
    if ((sVar18 == kmp_sch_guided_chunked) || (sVar27 = sVar18, sVar18 != kmp_sch_default)) {
      pkVar14 = (kmp_disp_t *)0x1;
      local_100 = (kmp_disp_t *)chunk;
      if (1 < chunk) {
        pkVar14 = (kmp_disp_t *)chunk;
      }
      goto LAB_0014c33b;
    }
    local_100 = (kmp_disp_t *)chunk;
    sVar27 = __kmp_static;
  }
  uVar22 = sVar27 - kmp_sch_static_chunked;
  if (0xe < uVar22) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/daniel-schuermann[P]openmp/runtime/src/kmp_dispatch.cpp"
                       ,0x2c9);
  }
  (pdVar26->u).p64.count = 0;
  if ((st == 0) && (__kmp_env_consistency_check != 0)) {
    __kmp_error_construct
              (kmp_i18n_msg_CnsLoopIncrZeroProhibited,ct_pdo_ordered - (pdVar26->ordered == 0),loc);
LAB_0014c4ce:
    if (lb <= ub) {
      uVar8 = (ulong)(ub - lb) / (ulong)st;
LAB_0014c4f8:
      bVar28 = false;
      goto LAB_0014c4fb;
    }
LAB_0014c4d6:
    bVar28 = false;
LAB_0014c4e2:
    uVar8 = 0;
  }
  else {
    if (st != 1) {
      if (-1 < st) goto LAB_0014c4ce;
      if (lb < ub) goto LAB_0014c4d6;
      uVar8 = (ulong)(lb - ub) / (ulong)-st;
      goto LAB_0014c4f8;
    }
    bVar28 = true;
    uVar8 = ub - lb;
    if (ub < lb) goto LAB_0014c4e2;
LAB_0014c4fb:
    uVar8 = uVar8 + 1;
  }
  (pdVar26->u).p64.lb = lb;
  (pdVar26->u).p64.ub = ub;
  (pdVar26->u).p64.st = st;
  (pdVar26->u).p64.tc = uVar8;
  if (iVar1 == 0) {
    if (pdVar26->ordered == 0) {
      pcVar9 = __kmp_dispatch_dxo_error;
      pcVar13 = __kmp_dispatch_deo_error;
    }
    else {
      pdVar26->ordered_bumped = 0;
      (pdVar26->u).p64.ordered_lower = 1;
      (pdVar26->u).p64.ordered_upper = 0;
      pcVar9 = __kmp_dispatch_dxo<unsigned_long_long>;
      pcVar13 = __kmp_dispatch_deo<unsigned_long_long>;
    }
    ((pkVar2->th).th_dispatch)->th_deo_fcn = pcVar13;
    ((pkVar2->th).th_dispatch)->th_dxo_fcn = pcVar9;
  }
  if (__kmp_env_consistency_check != 0) {
    ct = ct_pdo_ordered - (pdVar26->ordered == 0);
    if (push_ws == 0) {
      __kmp_check_workshare(gtid,ct,loc);
      ct = ct_none;
    }
    else {
      __kmp_push_workshare(gtid,ct,loc);
    }
    pdVar26->pushed_ws = ct;
  }
  if (0xd < uVar22) {
switchD_0014c5ee_caseD_1:
    __kmp_msg_format((kmp_msg_t *)&stack0xffffffffffffffa0,0x40058);
    __kmp_msg_format(&local_78,0x50016);
    __kmp_fatal();
  }
  pkVar14 = (kmp_disp_t *)
            ((long)&switchD_0014c5ee::switchdataD_0016a0c8 +
            (long)(int)(&switchD_0014c5ee::switchdataD_0016a0c8)[uVar22]);
  switch(uVar22) {
  case 0:
  case 2:
    if ((pdVar26->u).p64.field_6.parm1 < 1) {
      (pdVar26->u).p64.field_6.parm1 = 1;
    }
    goto LAB_0014c927;
  default:
    goto switchD_0014c5ee_caseD_1;
  case 6:
    pkVar14 = (kmp_disp_t *)((long)uVar8 / ((long)(pkVar2->th).th_team_nproc * 2));
    if ((long)pkVar14 < 2) {
      pkVar14 = (kmp_disp_t *)0x1;
    }
    pkVar23 = pkVar14;
    if (chunk < (long)pkVar14) {
      pkVar23 = (kmp_disp_t *)chunk;
    }
    if (chunk < 1) {
      pkVar23 = (kmp_disp_t *)0x1;
    }
    lVar10 = (long)&pkVar14->th_deo_fcn + (long)&pkVar23->th_deo_fcn;
    lVar10 = (long)(lVar10 + uVar8 * 2 + -1) / lVar10;
    lVar25 = 2;
    if (2 < lVar10) {
      lVar25 = lVar10;
    }
    (pdVar26->u).p64.field_6.parm1 = (kmp_int64)pkVar23;
    (pdVar26->u).p64.field_6.parm2 = (kmp_int64)pkVar14;
    (pdVar26->u).p64.field_6.parm3 = lVar25;
    (pdVar26->u).p64.field_6.parm4 = ((long)pkVar14 - (long)pkVar23) / (lVar25 + -1);
    sVar27 = kmp_sch_trapezoidal;
    goto LAB_0014c927;
  case 7:
    pkVar14 = (kmp_disp_t *)(long)(pkVar2->th).th_team_nproc;
    uVar11 = uVar8;
    if (1 < (long)pkVar14) {
      uVar11 = (long)((long)pkVar14 + (uVar8 - 1)) / (long)pkVar14;
    }
    (pdVar26->u).p64.field_6.parm1 = uVar11;
    break;
  case 8:
    iVar5 = (pkVar2->th).th_team_nproc;
    uVar24 = (ulong)iVar5;
    goto LAB_0014c66e;
  case 9:
  case 0xd:
    iVar5 = (pkVar2->th).th_team_nproc;
    lVar10 = (long)iVar5;
    if (1 < lVar10) {
      pkVar14 = (kmp_disp_t *)((chunk * 2 + 1) * lVar10);
      if ((long)pkVar14 < (long)uVar8) {
        (pdVar26->u).p64.field_6.parm2 = (chunk * 2 + 2) * lVar10;
        *(double *)((long)&pdVar26->u + 0x50) = 0.5 / (double)iVar5;
      }
      else {
        sVar27 = kmp_sch_dynamic_chunked;
      }
      goto LAB_0014c927;
    }
    goto LAB_0014c918;
  case 10:
    iVar5 = (pkVar2->th).th_team_nproc;
    if (1 < (long)iVar5) {
      pkVar14 = (kmp_disp_t *)((chunk * 2 + 1) * (long)iVar5);
      sVar27 = kmp_sch_dynamic_chunked;
      if ((long)pkVar14 < (long)uVar8) {
        lVar34 = (longdouble)-0.5 / (longdouble)iVar5 + (longdouble)1;
        *(longdouble *)((long)&pdVar26->u + 0x50) = lVar34;
        uVar11 = 0xe5;
        lVar30 = lVar34;
        lVar33 = (longdouble)1;
        do {
          lVar31 = lVar33 * lVar30;
          if ((uVar11 & 1) == 0) {
            lVar31 = lVar33;
          }
          lVar30 = lVar30 * lVar30;
          bVar28 = 1 < uVar11;
          uVar11 = uVar11 >> 1;
          lVar33 = lVar31;
        } while (bVar28);
        lVar30 = (((longdouble)1 + (longdouble)chunk + (longdouble)chunk) * (longdouble)iVar5) /
                 (longdouble)(long)uVar8;
        if (lVar31 <= lVar30) {
          uVar11 = 0xe5;
          uVar24 = 0;
        }
        else {
          uVar11 = 0xe5;
          do {
            uVar24 = uVar11;
            lVar31 = lVar31 * lVar31;
            uVar11 = uVar24 * 2;
            if (lVar31 <= lVar30) break;
          } while (uVar24 < 0x4000000);
        }
        if (uVar24 + 1 < uVar11) {
          do {
            uVar17 = uVar11 + uVar24 >> 1;
            lVar33 = (longdouble)1;
            if (1 < uVar11 + uVar24) {
              lVar33 = (longdouble)1;
              uVar16 = uVar17;
              lVar31 = lVar34;
              do {
                lVar32 = lVar33 * lVar31;
                if ((uVar16 & 1) == 0) {
                  lVar32 = lVar33;
                }
                lVar33 = lVar32;
                lVar31 = lVar31 * lVar31;
                bVar28 = 1 < uVar16;
                uVar16 = uVar16 >> 1;
              } while (bVar28);
            }
            if (lVar33 <= lVar30) {
              uVar11 = uVar17;
              uVar17 = uVar24;
            }
            uVar24 = uVar17;
          } while (uVar24 + 1 < uVar11);
          if (uVar11 == 0) {
            __kmp_debug_assert("assertion failure",
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/daniel-schuermann[P]openmp/runtime/src/kmp_dispatch.cpp"
                               ,0x412);
          }
        }
        lVar33 = (longdouble)1;
        if (uVar11 - 1 != 0) {
          lVar33 = (longdouble)1;
          uVar24 = uVar11 - 1;
          lVar31 = lVar34;
          do {
            lVar32 = lVar33 * lVar31;
            if ((uVar24 & 1) == 0) {
              lVar32 = lVar33;
            }
            lVar33 = lVar32;
            lVar31 = lVar31 * lVar31;
            bVar28 = 1 < uVar24;
            uVar24 = uVar24 >> 1;
          } while (bVar28);
        }
        if (lVar30 < lVar33) {
          uVar24 = uVar11;
          lVar33 = lVar34;
          lVar31 = (longdouble)1;
          do {
            lVar32 = lVar31 * lVar33;
            if ((uVar24 & 1) == 0) {
              lVar32 = lVar31;
            }
            lVar33 = lVar33 * lVar33;
            bVar28 = 1 < uVar24;
            uVar24 = uVar24 >> 1;
            lVar31 = lVar32;
          } while (bVar28);
          if (lVar32 <= lVar30) {
            *(ulong *)((long)&pdVar26->u + 0x48) = uVar11;
            lVar30 = (longdouble)1;
            uVar24 = uVar11;
            do {
              lVar33 = lVar30 * lVar34;
              if ((uVar24 & 1) == 0) {
                lVar33 = lVar30;
              }
              lVar30 = lVar33;
              lVar34 = lVar34 * lVar34;
              bVar28 = 1 < uVar24;
              uVar24 = uVar24 >> 1;
            } while (bVar28);
            lVar30 = lVar30 * (longdouble)(long)uVar8;
            lVar34 = (longdouble)9.223372e+18;
            lVar33 = (longdouble)0;
            if (lVar34 <= lVar30) {
              lVar33 = lVar34;
            }
            uVar24 = (ulong)(lVar34 <= lVar30) << 0x3f ^ (long)ROUND(lVar30 - lVar33);
            pkVar14 = (kmp_disp_t *)
                      ((lVar30 !=
                       (longdouble)(long)uVar24 +
                       (longdouble)*(float *)(&DAT_00169fe0 + (ulong)((long)uVar24 < 0) * 4)) +
                      uVar24);
            (pdVar26->u).p64.count = (uVar8 - uVar11 * chunk) - (long)pkVar14;
            sVar27 = kmp_sch_guided_analytical_chunked;
            goto LAB_0014c927;
          }
        }
        __kmp_debug_assert("assertion failure",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/daniel-schuermann[P]openmp/runtime/src/kmp_dispatch.cpp"
                           ,0x412);
      }
      goto LAB_0014c927;
    }
LAB_0014c918:
    (pdVar26->u).p64.field_6.parm1 = uVar8;
    break;
  case 0xb:
    iVar5 = (pkVar2->th).th_team_nproc;
    uVar24 = (ulong)iVar5;
    uVar11 = ((long)uVar8 / chunk + 1) - (ulong)((long)uVar8 % chunk == 0);
    if ((1 < (long)uVar24) && ((long)uVar24 <= (long)uVar11)) {
      uVar16 = (ulong)*(int *)(__kmp_threads[gtid]->th_pad + 0x20);
      uVar19 = uVar11 % uVar24;
      uVar17 = uVar19;
      if ((long)uVar16 <= (long)uVar19) {
        uVar17 = uVar16;
      }
      lVar10 = uVar17 + (uVar11 / uVar24) * uVar16;
      (pdVar26->u).p64.count = lVar10;
      (pdVar26->u).p64.ub = (ulong)((long)uVar16 < (long)uVar19) + uVar11 / uVar24 + lVar10;
      (pdVar26->u).p64.field_6.parm2 = lb;
      (pdVar26->u).p64.field_6.parm4 = (long)(uVar16 + 1) % (long)uVar24;
      (pdVar26->u).p64.st = st;
      pkVar12 = (kmp_int64 *)___kmp_allocate(0x40);
      pkVar14 = (pkVar2->th).th_dispatch;
      (pkVar14->field_8).th_doacross_info = pkVar12;
      __kmp_init_ticket_lock((((pkVar2->th).th_dispatch)->field_8).th_steal_lock);
      sVar27 = kmp_sch_static_steal;
      goto LAB_0014c927;
    }
LAB_0014c66e:
    if (iVar5 < 2) {
      if ((long)uVar8 < 1) {
LAB_0014ca6a:
        (pdVar26->u).p64.count = 1;
        (pdVar26->u).p64.field_6.parm1 = 0;
        sVar27 = kmp_sch_static_balanced;
        goto LAB_0014c927;
      }
      (pdVar26->u).p64.field_6.parm1 = 1;
      pkVar14 = (kmp_disp_t *)(uVar8 - 1);
      pkVar23 = (kmp_disp_t *)0x0;
    }
    else {
      pkVar15 = (kmp_disp_t *)(long)*(int *)(__kmp_threads[gtid]->th_pad + 0x20);
      if ((long)uVar8 < (long)uVar24) {
        pkVar14 = pkVar15;
        if ((long)uVar8 <= (long)pkVar15) goto LAB_0014ca6a;
        *(ulong *)((long)&pdVar26->u + 0x40) = (ulong)((kmp_disp_t *)(uVar8 - 1) == pkVar15);
        pkVar23 = pkVar15;
      }
      else {
        pkVar21 = (kmp_disp_t *)(uVar8 % uVar24);
        pkVar14 = pkVar21;
        if ((long)pkVar15 <= (long)pkVar21) {
          pkVar14 = pkVar15;
        }
        pkVar23 = (kmp_disp_t *)((long)&pkVar14->th_deo_fcn + (uVar8 / uVar24) * (long)pkVar15);
        pkVar14 = (kmp_disp_t *)
                  ((long)pkVar23 + (uVar8 / uVar24 - (ulong)((long)pkVar21 <= (long)pkVar15)));
        *(ulong *)((long)&pdVar26->u + 0x40) = (ulong)((kmp_disp_t *)(uVar24 - 1) == pkVar15);
      }
    }
    if (bVar29) {
      local_100 = (kmp_disp_t *)((long)pkVar14 + (1 - (long)pkVar23));
    }
    if (bVar28) {
      (pdVar26->u).p64.lb = (long)&pkVar23->th_deo_fcn + lb;
      lVar10 = (long)&pkVar14->th_deo_fcn + lb;
    }
    else {
      lVar10 = (long)pkVar14 * st + lb;
      (pdVar26->u).p64.lb = (long)pkVar23 * st + lb;
      if (st < 1) {
        if (lVar10 + st < ub) {
          lVar10 = ub;
        }
      }
      else if (ub < lVar10 + st) {
        lVar10 = ub;
      }
    }
    (pdVar26->u).p64.ub = lVar10;
    sVar27 = kmp_sch_static_balanced;
    if (pdVar26->ordered != 0) {
      (pdVar26->u).p64.ordered_lower = (kmp_uint64)pkVar23;
      (pdVar26->u).p64.ordered_upper = (kmp_uint64)pkVar14;
    }
    goto LAB_0014c927;
  case 0xc:
    pkVar14 = (kmp_disp_t *)(long)(pkVar2->th).th_team_nproc;
    if ((long)pkVar14 < 2) goto LAB_0014c918;
    pkVar14 = (kmp_disp_t *)
              (-chunk & chunk + (long)((long)pkVar14 + (uVar8 - 1)) / (long)pkVar14 + -1);
    (pdVar26->u).p64.field_6.parm1 = (kmp_int64)pkVar14;
  }
  sVar27 = kmp_sch_static_greedy;
LAB_0014c927:
  pdVar26->schedule = sVar27;
  if (iVar1 == 0) {
    __kmp_wait_yield<unsigned_int>(&local_a0->buffer_index,local_110,__kmp_eq<unsigned_int>,pkVar14)
    ;
    ((pkVar2->th).th_dispatch)->th_dispatch_pr_current = pdVar26;
    ((pkVar2->th).th_dispatch)->th_dispatch_sh_current = local_a0;
    if ((pdVar26->ordered != 0) && (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0)) {
      piVar4 = (__kmp_threads[gtid]->th).th_ident;
      if (piVar4 == (ident_t *)0x0) {
        pcVar20 = (char *)0x0;
      }
      else {
        pcVar20 = piVar4->psource;
      }
      (*(code *)__kmp_itt_sync_create_ptr__3_0)
                (((__kmp_threads[gtid]->th).th_dispatch)->th_dispatch_sh_current,"OMP Ordered",
                 pcVar20,0);
    }
    if (bVar29) {
      switch(sVar27) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced:
        sched_type = 0;
        break;
      default:
        sched_type = 3;
        break;
      case kmp_sch_dynamic_chunked:
        sched_type = 1;
        break;
      case kmp_sch_static_greedy:
        local_100 = (kmp_disp_t *)(pdVar26->u).p64.field_6.parm1;
        sched_type = 0;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      case kmp_sch_guided_simd:
        sched_type = 2;
      }
      __kmp_itt_metadata_loop(loc,sched_type,uVar8,(kmp_uint64)local_100);
    }
  }
  if (sVar27 == kmp_sch_static_steal) {
    pkVar12 = &(pdVar26->u).p64.static_steal_counter;
    *pkVar12 = *pkVar12 + 1;
  }
  return;
}

Assistant:

static void
__kmp_dispatch_init(ident_t *loc, int gtid, enum sched_type schedule, T lb,
                    T ub, typename traits_t<T>::signed_t st,
                    typename traits_t<T>::signed_t chunk, int push_ws) {
  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::signed_t ST;
  typedef typename traits_t<T>::floating_t DBL;

  int active;
  T tc;
  kmp_info_t *th;
  kmp_team_t *team;
  kmp_uint32 my_buffer_index;
  dispatch_private_info_template<T> *pr;
  dispatch_shared_info_template<UT> volatile *sh;

  KMP_BUILD_ASSERT(sizeof(dispatch_private_info_template<T>) ==
                   sizeof(dispatch_private_info));
  KMP_BUILD_ASSERT(sizeof(dispatch_shared_info_template<UT>) ==
                   sizeof(dispatch_shared_info));

  if (!TCR_4(__kmp_init_parallel))
    __kmp_parallel_initialize();

#if INCLUDE_SSC_MARKS
  SSC_MARK_DISPATCH_INIT();
#endif
#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_dispatch_init: T#%%d called: schedule:%%d "
                            "chunk:%%%s lb:%%%s ub:%%%s st:%%%s\n",
                            traits_t<ST>::spec, traits_t<T>::spec,
                            traits_t<T>::spec, traits_t<ST>::spec);
    KD_TRACE(10, (buff, gtid, schedule, chunk, lb, ub, st));
    __kmp_str_free(&buff);
  }
#endif
  /* setup data */
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  active = !team->t.t_serialized;
  th->th.th_ident = loc;

#if USE_ITT_BUILD
  kmp_uint64 cur_chunk = chunk;
  int itt_need_metadata_reporting = __itt_metadata_add_ptr &&
                                    __kmp_forkjoin_frames_mode == 3 &&
                                    KMP_MASTER_GTID(gtid) &&
#if OMP_40_ENABLED
                                    th->th.th_teams_microtask == NULL &&
#endif
                                    team->t.t_active_level == 1;
#endif
  if (!active) {
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        th->th.th_dispatch->th_disp_buffer); /* top of the stack */
  } else {
    KMP_DEBUG_ASSERT(th->th.th_dispatch ==
                     &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid]);

    my_buffer_index = th->th.th_dispatch->th_disp_index++;

    /* What happens when number of threads changes, need to resize buffer? */
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        &th->th.th_dispatch
             ->th_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
    sh = reinterpret_cast<dispatch_shared_info_template<UT> volatile *>(
        &team->t.t_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
  }

#if (KMP_STATIC_STEAL_ENABLED)
  if (SCHEDULE_HAS_NONMONOTONIC(schedule))
    // AC: we now have only one implementation of stealing, so use it
    schedule = kmp_sch_static_steal;
  else
#endif
    schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

  /* Pick up the nomerge/ordered bits from the scheduling type */
  if ((schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper)) {
    pr->nomerge = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
  } else {
    pr->nomerge = FALSE;
  }
  pr->type_size = traits_t<T>::type_size; // remember the size of variables
  if (kmp_ord_lower & schedule) {
    pr->ordered = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
  } else {
    pr->ordered = FALSE;
  }

  if (schedule == kmp_sch_static) {
    schedule = __kmp_static;
  } else {
    if (schedule == kmp_sch_runtime) {
      // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if
      // not specified)
      schedule = team->t.t_sched.r_sched_type;
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      } else if (schedule == kmp_sch_static) {
        schedule = __kmp_static;
      }
      // Use the chunk size specified by OMP_SCHEDULE (or default if not
      // specified)
      chunk = team->t.t_sched.chunk;
#if USE_ITT_BUILD
      cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d new: schedule:%%d chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    } else {
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      }
      if (chunk <= 0) {
        chunk = KMP_DEFAULT_CHUNK;
      }
    }

    if (schedule == kmp_sch_auto) {
      // mapping and differentiation: in the __kmp_do_serial_initialize()
      schedule = __kmp_auto;
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init: kmp_sch_auto: T#%%d new: "
                                "schedule:%%d chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }

    /* guided analytical not safe for too many threads */
    if (schedule == kmp_sch_guided_analytical_chunked &&
        th->th.th_team_nproc > 1 << 20) {
      schedule = kmp_sch_guided_iterative_chunked;
      KMP_WARNING(DispatchManyThreads);
    }
    if (schedule == kmp_sch_runtime_simd) {
      // compiler provides simd_width in the chunk parameter
      schedule = team->t.t_sched.r_sched_type;
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_static || schedule == kmp_sch_auto ||
          schedule == __kmp_static) {
        schedule = kmp_sch_static_balanced_chunked;
      } else {
        if (schedule == kmp_sch_guided_chunked || schedule == __kmp_guided) {
          schedule = kmp_sch_guided_simd;
        }
        chunk = team->t.t_sched.chunk * chunk;
      }
#if USE_ITT_BUILD
      cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init: T#%%d new: schedule:%%d"
                                " chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
    pr->u.p.parm1 = chunk;
  }
  KMP_ASSERT2((kmp_sch_lower < schedule && schedule < kmp_sch_upper),
              "unknown scheduling type");

  pr->u.p.count = 0;

  if (__kmp_env_consistency_check) {
    if (st == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                            (pr->ordered ? ct_pdo_ordered : ct_pdo), loc);
    }
  }
  // compute trip count
  if (st == 1) { // most common case
    if (ub >= lb) {
      tc = ub - lb + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  } else if (st < 0) {
    if (lb >= ub) {
      // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(lb - ub) / (-st) + 1;
    } else { // lb < ub
      tc = 0; // zero-trip
    }
  } else { // st > 0
    if (ub >= lb) {
      // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(ub - lb) / st + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  }

  // Any half-decent optimizer will remove this test when the blocks are empty
  // since the macros expand to nothing when statistics are disabled.
  if (schedule == __kmp_static) {
    KMP_COUNT_BLOCK(OMP_FOR_static);
    KMP_COUNT_VALUE(FOR_static_iterations, tc);
  } else {
    KMP_COUNT_BLOCK(OMP_FOR_dynamic);
    KMP_COUNT_VALUE(FOR_dynamic_iterations, tc);
  }

  pr->u.p.lb = lb;
  pr->u.p.ub = ub;
  pr->u.p.st = st;
  pr->u.p.tc = tc;

#if KMP_OS_WINDOWS
  pr->u.p.last_upper = ub + st;
#endif /* KMP_OS_WINDOWS */

  /* NOTE: only the active parallel region(s) has active ordered sections */

  if (active) {
    if (pr->ordered == 0) {
      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo_error;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo_error;
    } else {
      pr->ordered_bumped = 0;

      pr->u.p.ordered_lower = 1;
      pr->u.p.ordered_upper = 0;

      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo<UT>;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo<UT>;
    }
  }

  if (__kmp_env_consistency_check) {
    enum cons_type ws = pr->ordered ? ct_pdo_ordered : ct_pdo;
    if (push_ws) {
      __kmp_push_workshare(gtid, ws, loc);
      pr->pushed_ws = ws;
    } else {
      __kmp_check_workshare(gtid, ws, loc);
      pr->pushed_ws = ct_none;
    }
  }

  switch (schedule) {
#if (KMP_STATIC_STEAL_ENABLED)
  case kmp_sch_static_steal: {
    T nproc = th->th.th_team_nproc;
    T ntc, init;

    KD_TRACE(100,
             ("__kmp_dispatch_init: T#%d kmp_sch_static_steal case\n", gtid));

    ntc = (tc % chunk ? 1 : 0) + tc / chunk;
    if (nproc > 1 && ntc >= nproc) {
      KMP_COUNT_BLOCK(OMP_FOR_static_steal);
      T id = __kmp_tid_from_gtid(gtid);
      T small_chunk, extras;

      small_chunk = ntc / nproc;
      extras = ntc % nproc;

      init = id * small_chunk + (id < extras ? id : extras);
      pr->u.p.count = init;
      pr->u.p.ub = init + small_chunk + (id < extras ? 1 : 0);

      pr->u.p.parm2 = lb;
      // pr->pfields.parm3 = 0; // it's not used in static_steal
      pr->u.p.parm4 = (id + 1) % nproc; // remember neighbour tid
      pr->u.p.st = st;
      if (traits_t<T>::type_size > 4) {
        // AC: TODO: check if 16-byte CAS available and use it to
        // improve performance (probably wait for explicit request
        // before spending time on this).
        // For now use dynamically allocated per-thread lock,
        // free memory in __kmp_dispatch_next when status==0.
        KMP_DEBUG_ASSERT(th->th.th_dispatch->th_steal_lock == NULL);
        th->th.th_dispatch->th_steal_lock =
            (kmp_lock_t *)__kmp_allocate(sizeof(kmp_lock_t));
        __kmp_init_lock(th->th.th_dispatch->th_steal_lock);
      }
      break;
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to "
                     "kmp_sch_static_balanced\n",
                     gtid));
      schedule = kmp_sch_static_balanced;
      /* too few iterations: fall-through to kmp_sch_static_balanced */
    } // if
    /* FALL-THROUGH to static balanced */
  } // case
#endif
  case kmp_sch_static_balanced: {
    T nproc = th->th.th_team_nproc;
    T init, limit;

    KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_balanced case\n",
                   gtid));

    if (nproc > 1) {
      T id = __kmp_tid_from_gtid(gtid);

      if (tc < nproc) {
        if (id < tc) {
          init = id;
          limit = id;
          pr->u.p.parm1 = (id == tc - 1); /* parm1 stores *plastiter */
        } else {
          pr->u.p.count = 1; /* means no more chunks to execute */
          pr->u.p.parm1 = FALSE;
          break;
        }
      } else {
        T small_chunk = tc / nproc;
        T extras = tc % nproc;
        init = id * small_chunk + (id < extras ? id : extras);
        limit = init + small_chunk - (id < extras ? 0 : 1);
        pr->u.p.parm1 = (id == nproc - 1);
      }
    } else {
      if (tc > 0) {
        init = 0;
        limit = tc - 1;
        pr->u.p.parm1 = TRUE;
      } else { // zero trip count
        pr->u.p.count = 1; /* means no more chunks to execute */
        pr->u.p.parm1 = FALSE;
        break;
      }
    }
#if USE_ITT_BUILD
    // Calculate chunk for metadata report
    if (itt_need_metadata_reporting)
      cur_chunk = limit - init + 1;
#endif
    if (st == 1) {
      pr->u.p.lb = lb + init;
      pr->u.p.ub = lb + limit;
    } else {
      // calculated upper bound, "ub" is user-defined upper bound
      T ub_tmp = lb + limit * st;
      pr->u.p.lb = lb + init * st;
      // adjust upper bound to "ub" if needed, so that MS lastprivate will match
      // it exactly
      if (st > 0) {
        pr->u.p.ub = (ub_tmp + st > ub ? ub : ub_tmp);
      } else {
        pr->u.p.ub = (ub_tmp + st < ub ? ub : ub_tmp);
      }
    }
    if (pr->ordered) {
      pr->u.p.ordered_lower = init;
      pr->u.p.ordered_upper = limit;
    }
    break;
  } // case
  case kmp_sch_static_balanced_chunked: {
    // similar to balanced, but chunk adjusted to multiple of simd width
    T nth = th->th.th_team_nproc;
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d runtime(simd:static)"
                   " -> falling-through to static_greedy\n",
                   gtid));
    schedule = kmp_sch_static_greedy;
    if (nth > 1)
      pr->u.p.parm1 = ((tc + nth - 1) / nth + chunk - 1) & ~(chunk - 1);
    else
      pr->u.p.parm1 = tc;
    break;
  } // case
  case kmp_sch_guided_iterative_chunked:
  case kmp_sch_guided_simd: {
    T nproc = th->th.th_team_nproc;
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_iterative_chunked"
                   " case\n",
                   gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        // when remaining iters become less than parm2 - switch to dynamic
        pr->u.p.parm2 = guided_int_param * nproc * (chunk + 1);
        *(double *)&pr->u.p.parm3 =
            guided_flt_param / nproc; // may occupy parm3 and parm4
      }
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",
                     gtid));
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_guided_analytical_chunked: {
    T nproc = th->th.th_team_nproc;
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_analytical_chunked"
                   " case\n",
                   gtid));
    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        DBL x;

#if KMP_OS_WINDOWS && KMP_ARCH_X86
        /* Linux* OS already has 64-bit computation by default for long double,
           and on Windows* OS on Intel(R) 64, /Qlong_double doesn't work. On
           Windows* OS on IA-32 architecture, we need to set precision to 64-bit
           instead of the default 53-bit. Even though long double doesn't work
           on Windows* OS on Intel(R) 64, the resulting lack of precision is not
           expected to impact the correctness of the algorithm, but this has not
           been mathematically proven. */
        // save original FPCW and set precision to 64-bit, as
        // Windows* OS on IA-32 architecture defaults to 53-bit
        unsigned int oldFpcw = _control87(0, 0);
        _control87(_PC_64, _MCW_PC); // 0,0x30000
#endif
        /* value used for comparison in solver for cross-over point */
        long double target = ((long double)chunk * 2 + 1) * nproc / tc;

        /* crossover point--chunk indexes equal to or greater than
           this point switch to dynamic-style scheduling */
        UT cross;

        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        x = (long double)1.0 - (long double)0.5 / nproc;

#ifdef KMP_DEBUG
        { // test natural alignment
          struct _test_a {
            char a;
            union {
              char b;
              DBL d;
            };
          } t;
          ptrdiff_t natural_alignment =
              (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
          //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long
          // long)natural_alignment );
          KMP_DEBUG_ASSERT(
              (((ptrdiff_t)&pr->u.p.parm3) & (natural_alignment)) == 0);
        }
#endif // KMP_DEBUG

        /* save the term in thread private dispatch structure */
        *(DBL *)&pr->u.p.parm3 = x;

        /* solve for the crossover point to the nearest integer i for which C_i
           <= chunk */
        {
          UT left, right, mid;
          long double p;

          /* estimate initial upper and lower bound */

          /* doesn't matter what value right is as long as it is positive, but
             it affects performance of the solver */
          right = 229;
          p = __kmp_pow<UT>(x, right);
          if (p > target) {
            do {
              p *= p;
              right <<= 1;
            } while (p > target && right < (1 << 27));
            /* lower bound is previous (failed) estimate of upper bound */
            left = right >> 1;
          } else {
            left = 0;
          }

          /* bisection root-finding method */
          while (left + 1 < right) {
            mid = (left + right) / 2;
            if (__kmp_pow<UT>(x, mid) > target) {
              left = mid;
            } else {
              right = mid;
            }
          } // while
          cross = right;
        }
        /* assert sanity of computed crossover point */
        KMP_ASSERT(cross && __kmp_pow<UT>(x, cross - 1) > target &&
                   __kmp_pow<UT>(x, cross) <= target);

        /* save the crossover point in thread private dispatch structure */
        pr->u.p.parm2 = cross;

// C75803
#if ((KMP_OS_LINUX || KMP_OS_WINDOWS) && KMP_ARCH_X86) && (!defined(KMP_I8))
#define GUIDED_ANALYTICAL_WORKAROUND (*(DBL *)&pr->u.p.parm3)
#else
#define GUIDED_ANALYTICAL_WORKAROUND (x)
#endif
        /* dynamic-style scheduling offset */
        pr->u.p.count = tc - __kmp_dispatch_guided_remaining(
                                 tc, GUIDED_ANALYTICAL_WORKAROUND, cross) -
                        cross * chunk;
#if KMP_OS_WINDOWS && KMP_ARCH_X86
        // restore FPCW
        _control87(oldFpcw, _MCW_PC);
#endif
      } // if
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_static_greedy:
    KD_TRACE(100,
             ("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n", gtid));
    pr->u.p.parm1 = (th->th.th_team_nproc > 1)
                        ? (tc + th->th.th_team_nproc - 1) / th->th.th_team_nproc
                        : tc;
    break;
  case kmp_sch_static_chunked:
  case kmp_sch_dynamic_chunked:
    if (pr->u.p.parm1 <= 0) {
      pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
    }
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d "
                   "kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n",
                   gtid));
    break;
  case kmp_sch_trapezoidal: {
    /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

    T parm1, parm2, parm3, parm4;
    KD_TRACE(100,
             ("__kmp_dispatch_init: T#%d kmp_sch_trapezoidal case\n", gtid));

    parm1 = chunk;

    /* F : size of the first cycle */
    parm2 = (tc / (2 * th->th.th_team_nproc));

    if (parm2 < 1) {
      parm2 = 1;
    }

    /* L : size of the last cycle.  Make sure the last cycle is not larger
       than the first cycle. */
    if (parm1 < 1) {
      parm1 = 1;
    } else if (parm1 > parm2) {
      parm1 = parm2;
    }

    /* N : number of cycles */
    parm3 = (parm2 + parm1);
    parm3 = (2 * tc + parm3 - 1) / parm3;

    if (parm3 < 2) {
      parm3 = 2;
    }

    /* sigma : decreasing incr of the trapezoid */
    parm4 = (parm3 - 1);
    parm4 = (parm2 - parm1) / parm4;

    // pointless check, because parm4 >= 0 always
    // if ( parm4 < 0 ) {
    //    parm4 = 0;
    //}

    pr->u.p.parm1 = parm1;
    pr->u.p.parm2 = parm2;
    pr->u.p.parm3 = parm3;
    pr->u.p.parm4 = parm4;
  } // case
  break;

  default: {
    __kmp_fatal(KMP_MSG(UnknownSchedTypeDetected), // Primary message
                KMP_HNT(GetNewerLibrary), // Hint
                __kmp_msg_null // Variadic argument list terminator
                );
  } break;
  } // switch
  pr->schedule = schedule;
  if (active) {
    /* The name of this buffer should be my_buffer_index when it's free to use
     * it */

    KD_TRACE(100, ("__kmp_dispatch_init: T#%d before wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));
    __kmp_wait_yield<kmp_uint32>(&sh->buffer_index, my_buffer_index,
                                 __kmp_eq<kmp_uint32> USE_ITT_BUILD_ARG(NULL));
    // Note: KMP_WAIT_YIELD() cannot be used there: buffer index and
    // my_buffer_index are *always* 32-bit integers.
    KMP_MB(); /* is this necessary? */
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d after wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));

    th->th.th_dispatch->th_dispatch_pr_current = (dispatch_private_info_t *)pr;
    th->th.th_dispatch->th_dispatch_sh_current =
        CCAST(dispatch_shared_info_t *, (volatile dispatch_shared_info_t *)sh);
#if USE_ITT_BUILD
    if (pr->ordered) {
      __kmp_itt_ordered_init(gtid);
    }
    // Report loop metadata
    if (itt_need_metadata_reporting) {
      // Only report metadata by master of active team at level 1
      kmp_uint64 schedtype = 0;
      switch (schedule) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced: // Chunk is calculated in the switch above
        break;
      case kmp_sch_static_greedy:
        cur_chunk = pr->u.p.parm1;
        break;
      case kmp_sch_dynamic_chunked:
        schedtype = 1;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      case kmp_sch_guided_simd:
        schedtype = 2;
        break;
      default:
        // Should we put this case under "static"?
        // case kmp_sch_static_steal:
        schedtype = 3;
        break;
      }
      __kmp_itt_metadata_loop(loc, schedtype, tc, cur_chunk);
    }
#endif /* USE_ITT_BUILD */
  }

#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format(
        "__kmp_dispatch_init: T#%%d returning: schedule:%%d ordered:%%%s "
        "lb:%%%s ub:%%%s"
        " st:%%%s tc:%%%s count:%%%s\n\tordered_lower:%%%s ordered_upper:%%%s"
        " parm1:%%%s parm2:%%%s parm3:%%%s parm4:%%%s\n",
        traits_t<UT>::spec, traits_t<T>::spec, traits_t<T>::spec,
        traits_t<ST>::spec, traits_t<UT>::spec, traits_t<UT>::spec,
        traits_t<UT>::spec, traits_t<UT>::spec, traits_t<T>::spec,
        traits_t<T>::spec, traits_t<T>::spec, traits_t<T>::spec);
    KD_TRACE(10, (buff, gtid, pr->schedule, pr->ordered, pr->u.p.lb, pr->u.p.ub,
                  pr->u.p.st, pr->u.p.tc, pr->u.p.count, pr->u.p.ordered_lower,
                  pr->u.p.ordered_upper, pr->u.p.parm1, pr->u.p.parm2,
                  pr->u.p.parm3, pr->u.p.parm4));
    __kmp_str_free(&buff);
  }
#endif
#if (KMP_STATIC_STEAL_ENABLED)
  // It cannot be guaranteed that after execution of a loop with some other
  // schedule kind all the parm3 variables will contain the same value. Even if
  // all parm3 will be the same, it still exists a bad case like using 0 and 1
  // rather than program life-time increment. So the dedicated variable is
  // required. The 'static_steal_counter' is used.
  if (schedule == kmp_sch_static_steal) {
    // Other threads will inspect this variable when searching for a victim.
    // This is a flag showing that other threads may steal from this thread
    // since then.
    volatile T *p = &pr->u.p.static_steal_counter;
    *p = *p + 1;
  }
#endif // ( KMP_STATIC_STEAL_ENABLED )

#if OMPT_SUPPORT && OMPT_OPTIONAL
  if (ompt_enabled.ompt_callback_work) {
    ompt_team_info_t *team_info = __ompt_get_teaminfo(0, NULL);
    ompt_task_info_t *task_info = __ompt_get_task_info_object(0);
    kmp_info_t *thr = __kmp_threads[gtid];
    ompt_callbacks.ompt_callback(ompt_callback_work)(
        ompt_work_loop, ompt_scope_begin, &(team_info->parallel_data),
        &(task_info->task_data), tc, OMPT_LOAD_RETURN_ADDRESS(gtid));
  }
#endif
}